

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileColliderTests.cpp
# Opt level: O0

void __thiscall
solitaire::colliders::FoundationPileColliderTests_collidesWithCard_Test::
~FoundationPileColliderTests_collidesWithCard_Test
          (FoundationPileColliderTests_collidesWithCard_Test *this)

{
  FoundationPileColliderTests_collidesWithCard_Test *this_local;
  
  ~FoundationPileColliderTests_collidesWithCard_Test(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST_F(FoundationPileColliderTests, collidesWithCard) {
    EXPECT_FALSE(collider.collidesWithCardsInHand(topLeftCorner - Position {cardSize.width, 0}));
    EXPECT_FALSE(collider.collidesWithCardsInHand(topLeftCorner - Position {0, cardSize.height}));
    EXPECT_FALSE(collider.collidesWithCardsInHand(topLeftCorner + Position {cardSize.width, 0}));
    EXPECT_FALSE(collider.collidesWithCardsInHand(topLeftCorner + Position {0, cardSize.height}));

    EXPECT_TRUE(collider.collidesWithCardsInHand(
        topLeftCorner - Position {cardSize.width - 1, cardSize.height - 1}));
    EXPECT_TRUE(collider.collidesWithCardsInHand(bottomRightCorner));
}